

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O3

void Omega_h::separate_upward_with_codes
               (LO nlh,LOs *lh2hl,Int nlows_per_high,Write<int> *lh2h,Bytes *down_codes,
               Write<signed_char> *codes)

{
  size_t *psVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong **__dest;
  Alloc *pAVar8;
  ulong *puVar9;
  ulong uVar10;
  long lVar11;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  size_type __dnew;
  type f;
  ScopedTimer local_159;
  Int local_158;
  ScopedTimer local_151;
  ulong **local_150;
  ulong *local_148;
  ulong *local_140 [2];
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  Alloc *local_110;
  void *local_108;
  undefined1 local_100 [56];
  Alloc *local_c8;
  LO local_bc;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  Alloc *local_98;
  void *local_90;
  undefined1 local_88 [32];
  void *local_68;
  Alloc *local_60;
  void *local_58;
  Alloc *local_50;
  Alloc *local_48;
  Alloc *local_40;
  void *local_38;
  
  local_130 = &local_120;
  local_158 = nlows_per_high;
  local_bc = nlh;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_130);
  pAVar8 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar8) {
    local_88._0_8_ = pAVar8->size;
    local_88._8_8_ = plVar6[3];
    local_98 = (Alloc *)local_88;
  }
  else {
    local_88._0_8_ = pAVar8->size;
    local_98 = (Alloc *)*plVar6;
  }
  local_90 = (void *)plVar6[1];
  *plVar6 = (long)pAVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_150 = local_140;
  std::__cxx11::string::_M_construct((ulong)&local_150,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_150,3,0xcd);
  puVar9 = (ulong *)0xf;
  if (local_98 != (Alloc *)local_88) {
    puVar9 = (ulong *)local_88._0_8_;
  }
  if (puVar9 < (ulong *)((long)local_148 + (long)local_90)) {
    puVar9 = (ulong *)0xf;
    if (local_150 != local_140) {
      puVar9 = local_140[0];
    }
    if (puVar9 < (ulong *)((long)local_148 + (long)local_90)) goto LAB_001c9e8a;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_001c9e8a:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_150);
  }
  local_110 = (Alloc *)local_100;
  psVar1 = puVar7 + 2;
  if ((size_t *)*puVar7 == psVar1) {
    local_100._0_8_ = *psVar1;
    local_100._8_8_ = puVar7[3];
  }
  else {
    local_100._0_8_ = *psVar1;
    local_110 = (Alloc *)*puVar7;
  }
  local_108 = (void *)puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(char *)psVar1 = '\0';
  begin_code("separate_upward_with_codes",(char *)local_110);
  if (local_110 != (Alloc *)local_100) {
    operator_delete(local_110,local_100._0_8_ + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,(long)local_140[0] + 1);
  }
  if (local_98 != (Alloc *)local_88) {
    operator_delete(local_98,local_88._0_8_ + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  local_98 = (lh2hl->write_).shared_alloc_.alloc;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(local_98->size * 8 + 1);
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  local_90 = (lh2hl->write_).shared_alloc_.direct_ptr;
  local_88._0_4_ = local_158;
  local_88._8_8_ = (lh2h->shared_alloc_).alloc;
  if ((local_88._8_8_ & 7) == 0 && (Alloc *)local_88._8_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88._8_8_ = ((Alloc *)local_88._8_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_88._8_8_)->use_count = ((Alloc *)local_88._8_8_)->use_count + 1;
    }
  }
  pvVar3 = (lh2h->shared_alloc_).direct_ptr;
  local_88._24_8_ = (down_codes->write_).shared_alloc_.alloc;
  if ((local_88._24_8_ & 7) == 0 && (Alloc *)local_88._24_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88._24_8_ = ((Alloc *)local_88._24_8_)->size * 8 + 1;
    }
    else {
      ((Alloc *)local_88._24_8_)->use_count = ((Alloc *)local_88._24_8_)->use_count + 1;
    }
  }
  pvVar4 = (down_codes->write_).shared_alloc_.direct_ptr;
  local_60 = (codes->shared_alloc_).alloc;
  if (((ulong)local_60 & 7) == 0 && local_60 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60 = (Alloc *)(local_60->size * 8 + 1);
    }
    else {
      local_60->use_count = local_60->use_count + 1;
    }
  }
  pvVar5 = (codes->shared_alloc_).direct_ptr;
  local_150 = local_140;
  local_b8 = (ulong *)0x5d;
  local_c8 = local_60;
  local_88._16_8_ = pvVar3;
  local_68 = pvVar4;
  local_58 = pvVar5;
  local_50 = (Alloc *)local_88._24_8_;
  local_48 = (Alloc *)local_88._8_8_;
  local_40 = local_98;
  local_38 = local_90;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_150,(ulong)&local_b8);
  puVar9 = local_b8;
  local_140[0] = local_b8;
  local_150 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_148 = puVar9;
  *(undefined1 *)((long)__dest + (long)puVar9) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_120 = *puVar9;
    lStack_118 = plVar6[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar9;
    local_130 = (ulong *)*plVar6;
  }
  local_128 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,'\x02');
  *(undefined2 *)local_b8 = 0x3438;
  uVar10 = 0xf;
  if (local_130 != &local_120) {
    uVar10 = local_120;
  }
  if (uVar10 < (ulong)(local_b0 + local_128)) {
    uVar10 = 0xf;
    if (local_b8 != local_a8) {
      uVar10 = local_a8[0];
    }
    if ((ulong)(local_b0 + local_128) <= uVar10) {
      plVar6 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_b8,0,(char *)0x0,(ulong)local_130);
      goto LAB_001ca237;
    }
  }
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_b8);
LAB_001ca237:
  pAVar8 = (Alloc *)(plVar6 + 2);
  if ((Alloc *)*plVar6 == pAVar8) {
    local_100._0_8_ = pAVar8->size;
    local_100._8_8_ = plVar6[3];
    local_110 = (Alloc *)local_100;
  }
  else {
    local_100._0_8_ = pAVar8->size;
    local_110 = (Alloc *)*plVar6;
  }
  local_108 = (void *)plVar6[1];
  *plVar6 = (long)pAVar8;
  plVar6[1] = 0;
  *(undefined1 *)&pAVar8->size = 0;
  begin_code("parallel_for",(char *)local_110);
  if (local_110 != (Alloc *)local_100) {
    operator_delete(local_110,local_100._0_8_ + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,(long)local_140[0] + 1);
  }
  if (0 < local_bc) {
    local_110 = local_40;
    if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
      local_110 = (Alloc *)(local_40->size * 8 + 1);
    }
    local_108 = local_38;
    local_100._0_4_ = local_158;
    local_100._8_8_ = local_48;
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      local_100._8_8_ = local_48->size * 8 + 1;
    }
    local_100._24_8_ = local_50;
    if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
      local_100._24_8_ = local_50->size * 8 + 1;
    }
    local_100._40_8_ = local_c8;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_100._40_8_ = local_c8->size * 8 + 1;
    }
    entering_parallel = '\0';
    lVar11 = 0;
    do {
      iVar2 = *(int *)((long)local_38 + lVar11 * 4);
      *(int *)((long)pvVar3 + lVar11 * 4) = iVar2 / local_158;
      *(byte *)((long)pvVar5 + lVar11) =
           *(byte *)((long)pvVar4 + (long)iVar2) & 7 | (char)(iVar2 % local_158) << 3;
      lVar11 = lVar11 + 1;
    } while (local_bc != (int)lVar11);
    local_100._16_8_ = pvVar3;
    local_100._32_8_ = pvVar4;
    local_100._48_8_ = pvVar5;
    separate_upward_with_codes(int,Omega_h::Read<int>,int,Omega_h::Write<int>,Omega_h::Read<signed_char>,Omega_h::Write<signed_char>)
    ::$_0::~__0((__0 *)&local_110);
  }
  ScopedTimer::~ScopedTimer(&local_151);
  separate_upward_with_codes(int,Omega_h::Read<int>,int,Omega_h::Write<int>,Omega_h::Read<signed_char>,Omega_h::Write<signed_char>)
  ::$_0::~__0((__0 *)&local_98);
  ScopedTimer::~ScopedTimer(&local_159);
  return;
}

Assistant:

void separate_upward_with_codes(LO const nlh, LOs const lh2hl,
    Int const nlows_per_high, Write<LO> const lh2h, Bytes const down_codes,
    Write<Byte> const codes) {
  OMEGA_H_TIME_FUNCTION;
  auto f = OMEGA_H_LAMBDA(LO lh) {
    LO const hl = lh2hl[lh];
    LO const h = hl / nlows_per_high;
    lh2h[lh] = h;
    Int const which_down = hl % nlows_per_high;
    auto const down_code = down_codes[hl];
    bool const is_flipped = code_is_flipped(down_code);
    Int const rotation = code_rotation(down_code);
    codes[lh] = make_code(is_flipped, rotation, which_down);
  };
  parallel_for(nlh, std::move(f));
}